

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_123::PromisedAsyncIoStream::abortRead(PromisedAsyncIoStream *this)

{
  AsyncIoStream *pAVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  ForkHub<kj::_::Void> *location;
  void *continuationTracePtr;
  ForkedPromise<void> local_50;
  anon_class_8_1_8991fb9c_for_func local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  code *local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  pAVar1 = (this->stream).ptr.ptr;
  if (pAVar1 != (AsyncIoStream *)0x0) {
    (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[7])();
    return;
  }
  ForkedPromise<void>::addBranch(&local_50);
  local_30 = kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2472:42)>
             ::anon_class_8_1_8991fb9c_for_func::operator();
  pp_Var2 = local_50.hub.disposer[1]._vptr_Disposer;
  local_40.this = this;
  if (pp_Var2 == (_func_int **)0x0 || (ulong)((long)local_50.hub.disposer - (long)pp_Var2) < 0x28) {
    pvVar3 = operator_new(0x400);
    location = (ForkHub<kj::_::Void> *)((long)pvVar3 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromisedAsyncIoStream::abortRead()::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromisedAsyncIoStream::abortRead()::_lambda()_1_,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2472:42)>
                *)location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50,&local_40,
               &local_30);
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_50.hub.disposer[1]._vptr_Disposer = (_func_int **)0x0;
    location = (ForkHub<kj::_::Void> *)(local_50.hub.disposer + -5);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromisedAsyncIoStream::abortRead()::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromisedAsyncIoStream::abortRead()::_lambda()_1_,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2472:42)>
                *)location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50,&local_40,
               &local_30);
    local_50.hub.disposer[-4]._vptr_Disposer = pp_Var2;
  }
  local_38.ptr = (PromiseNode *)0x0;
  local_28.ptr = (PromiseNode *)0x0;
  local_50.hub.ptr = location;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  TaskSet::add(&this->tasks,(Promise<void> *)&local_50.hub.ptr);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50.hub.ptr);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50);
  return;
}

Assistant:

void abortRead() override {
    KJ_IF_SOME(s, stream) {
      return s->abortRead();
    } else {
      tasks.add(promise.addBranch().then([this]() {
        return KJ_ASSERT_NONNULL(stream)->abortRead();
      }));
    }
  }